

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O1

BoolExpr * BO_xor(List *ls)

{
  BoolExprStruct **ppBVar1;
  BoolExpr *pBVar2;
  BoolExpr *pBVar3;
  BoolExpr *pBVar4;
  BoolExprStruct *pBVar5;
  bool bVar6;
  int iVar7;
  ListStruct *ls_00;
  
  pBVar2 = (BoolExpr *)malloc(0x18);
  pBVar2->type = E_XOR;
  ppBVar1 = &pBVar2->subexpr;
  pBVar2->subexpr = (BoolExprStruct *)0x0;
  pBVar2->next = (BoolExprStruct *)0x0;
  ls_00 = ls->cdr;
  if (ls_00 == (ListStruct *)0x0) {
    bVar6 = true;
    iVar7 = 0;
  }
  else {
    bVar6 = false;
    iVar7 = 0;
    do {
      pBVar3 = make_boolean_expr(ls_00);
      if (pBVar3->type != E_FALSE) {
        if (pBVar3->type == E_TRUE) {
          bVar6 = !bVar6;
          if (iVar7 == 1) {
            iVar7 = 0;
          }
          else if (iVar7 == 0) {
            iVar7 = 1;
          }
          else {
            pBVar3->next = *ppBVar1;
            *ppBVar1 = pBVar3;
          }
        }
        else {
          pBVar3->next = *ppBVar1;
          *ppBVar1 = pBVar3;
          iVar7 = 2;
        }
      }
      ls_00 = ls_00->cdr;
    } while (ls_00 != (ListStruct *)0x0);
    bVar6 = !bVar6;
  }
  pBVar3 = *ppBVar1;
  if (pBVar3 == (BoolExpr *)0x0) {
    parse_error((List *)0x0,"xor takes arguments!\n");
  }
  else {
    if (iVar7 == 1) {
      return &true_bool_expr;
    }
    if (iVar7 != 0) {
      pBVar4 = pBVar2;
      if (pBVar3->next == (BoolExprStruct *)0x0) {
        pBVar4 = pBVar3;
      }
      if (bVar6) {
        return pBVar4;
      }
      pBVar5 = (BoolExprStruct *)malloc(0x18);
      pBVar5->type = E_TRUE;
      pBVar5->subexpr = (BoolExprStruct *)0x0;
      pBVar5->next = pBVar3;
      *ppBVar1 = pBVar5;
      return pBVar2;
    }
  }
  return &false_bool_expr;
}

Assistant:

static BoolExpr *
BO_xor (const List *ls)
{
  BoolExpr *subexpr, *ret;
  BoolExprType answer = E_FALSE;
  BOOL odd_trues = NO;

  ret = create_bool_expr (E_XOR, NULL);
  while ((ls = ls->cdr))
    {
      subexpr = make_boolean_expr (ls);
      if (subexpr->type == E_TRUE)
	{
	  odd_trues = !odd_trues;

	  if (answer == E_TRUE) answer = E_FALSE;
	  else if (answer == E_FALSE) answer = E_TRUE;
	  else
	    {
	      subexpr->next = ret->subexpr;
	      ret->subexpr = subexpr;
	    }
	}
      else if (subexpr->type != E_FALSE)
	{
	  subexpr->next = ret->subexpr;
	  ret->subexpr = subexpr;
	  answer = E_UNKNOWN;
	}
    }

  if (ret->subexpr == NULL)
    {
      parse_error(ls, "xor takes arguments!\n");
      return &false_bool_expr;   /* Default = FALSE */
    }

  if (answer == E_TRUE)
    return &true_bool_expr;
  else if (answer == E_FALSE)
    return &false_bool_expr;
  
  if (ret->subexpr->next == NULL && !odd_trues) /* (xor a) == a */
    return ret->subexpr;
  if (odd_trues)  /* If there were an odd number of TRUE's, toss one in. */
    {
      subexpr = create_bool_expr (E_TRUE, NULL);
      subexpr->next = ret->subexpr;
      ret->subexpr = subexpr;
    }
  
  return ret;
}